

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O3

void __thiscall HDual::major_chooseRow(HDual *this)

{
  HDualRHS *this_00;
  MChoice *pMVar1;
  double dVar2;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  int iVar11;
  MChoice *pMVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int *chIndex;
  int *piVar18;
  uint uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  undefined8 uStack_50;
  int aiStack_48 [2];
  undefined1 *local_40;
  uint local_34;
  double dVar3;
  
  piVar18 = aiStack_48;
  if ((this->model->countUpdate == 0) || (this->multi_chooseAgain != 0)) {
    this->multi_chooseAgain = 0;
    this->multi_iteration = this->multi_iteration + 1;
    this_00 = &this->dualRHS;
    local_34 = 0;
    lVar17 = -((ulong)(uint)this->multi_num * 4 + 0xf & 0xfffffffffffffff0);
    chIndex = (int *)((long)aiStack_48 + lVar17);
    iVar4 = this->multi_num;
    *(undefined8 *)((long)&uStack_50 + lVar17) = 0x11ce10;
    HDualRHS::choose_multi_HGauto(this_00,chIndex,(int *)&local_34,iVar4);
    dVar20 = (this->dualRHS).workCutoff;
    if ((local_34 != 0) || ((dVar20 != 0.0 || (NAN(dVar20))))) {
      pMVar1 = this->multi_choice;
      do {
        uVar10 = local_34;
        auVar24 = _DAT_001560a0;
        local_40 = (undefined1 *)piVar18;
        uVar19 = 0;
        if (0 < (int)local_34) {
          pdVar5 = (this->dualRHS).workArray.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = (ulong)local_34;
          uVar15 = 0;
          uVar19 = 0;
          do {
            iVar4 = chIndex[uVar15];
            if (dVar20 <= pdVar5[iVar4] / pdVar6[iVar4]) {
              lVar17 = (long)(int)uVar19;
              uVar19 = uVar19 + 1;
              chIndex[lVar17] = iVar4;
            }
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
        if ((uVar10 == 0) || ((int)uVar19 <= (int)uVar10 / 3)) {
          dVar20 = this->columnDensity;
          chIndex[-2] = 0x11d0e9;
          chIndex[-1] = 0;
          HDualRHS::create_infeasList(this_00,dVar20);
        }
        else {
          iVar4 = this->multi_num;
          if (0 < (long)iVar4) {
            lVar17 = (long)iVar4 + -1;
            auVar21._8_4_ = (int)lVar17;
            auVar21._0_8_ = lVar17;
            auVar21._12_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar21 = auVar21 ^ _DAT_001560a0;
            lVar17 = 0;
            auVar23 = _DAT_00156090;
            auVar25 = _DAT_001560e0;
            do {
              auVar26 = auVar23 ^ auVar24;
              iVar11 = auVar21._4_4_;
              if ((bool)(~(auVar26._4_4_ == iVar11 && auVar21._0_4_ < auVar26._0_4_ ||
                          iVar11 < auVar26._4_4_) & 1)) {
                *(undefined4 *)((long)&this->multi_choice[0].rowOut + lVar17) = 0xffffffff;
              }
              if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
                  auVar26._12_4_ <= auVar21._12_4_) {
                *(undefined4 *)((long)&this->multi_choice[1].rowOut + lVar17) = 0xffffffff;
              }
              auVar26 = auVar25 ^ auVar24;
              iVar27 = auVar26._4_4_;
              if (iVar27 <= iVar11 && (iVar27 != iVar11 || auVar26._0_4_ <= auVar21._0_4_)) {
                *(undefined4 *)((long)&this->multi_choice[2].rowOut + lVar17) = 0xffffffff;
                *(undefined4 *)((long)&this->multi_choice[3].rowOut + lVar17) = 0xffffffff;
              }
              lVar14 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 4;
              auVar23._8_8_ = lVar14 + 4;
              lVar14 = auVar25._8_8_;
              auVar25._0_8_ = auVar25._0_8_ + 4;
              auVar25._8_8_ = lVar14 + 4;
              lVar17 = lVar17 + 0x980;
            } while ((ulong)(iVar4 + 3U >> 2) * 0x980 - lVar17 != 0);
          }
          if (0 < (int)uVar19) {
            uVar13 = 0;
            pMVar12 = pMVar1;
            do {
              pMVar12->rowOut = chIndex[uVar13];
              uVar13 = uVar13 + 1;
              pMVar12 = pMVar12 + 1;
            } while (uVar19 != uVar13);
          }
          chIndex[-2] = 0x11cfed;
          chIndex[-1] = 0;
          major_chooseRowBtran(this);
          iVar4 = this->multi_num;
          iVar11 = 0;
          if (0 < (long)iVar4) {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = this->row_epDensity;
            lVar17 = (long)iVar4 * 0x260;
            lVar14 = 0;
            do {
              if (-1 < *(int *)((long)&this->multi_choice[0].rowOut + lVar14)) {
                auVar24._0_8_ =
                     auVar24._0_8_ * 0.95 +
                     ((double)*(int *)((long)&this->multi_choice[0].row_ep.count + lVar14) * 0.05) /
                     (double)this->numRow;
                this->row_epDensity = auVar24._0_8_;
              }
              lVar14 = lVar14 + 0x260;
            } while (lVar17 - lVar14 != 0);
            iVar11 = 0;
            if (0 < iVar4) {
              pdVar5 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar14 = 0;
              iVar11 = 0;
              do {
                lVar16 = (long)*(int *)((long)&pMVar1->rowOut + lVar14);
                if ((-1 < lVar16) &&
                   (dVar20 = *(double *)((long)&this->multi_choice[0].infeasEdWt + lVar14),
                   dVar22 = dVar20 * 0.25, pdVar7 = pdVar5 + lVar16, dVar2 = *pdVar7,
                   dVar3 = *pdVar7, pdVar5[lVar16] = dVar20, dVar3 <= dVar22 && dVar22 != dVar2)) {
                  *(undefined4 *)((long)&pMVar1->rowOut + lVar14) = 0xffffffff;
                  iVar11 = iVar11 + 1;
                }
                lVar14 = lVar14 + 0x260;
              } while (lVar17 - lVar14 != 0);
            }
          }
          if (iVar11 <= (int)uVar19 / 3) {
            iVar4 = this->multi_num;
            if (0 < (long)iVar4) {
              dVar20 = this->model->dblOption[4];
              pdVar7 = this->baseValue;
              pdVar8 = this->baseLower;
              pdVar9 = this->baseUpper;
              pdVar5 = (this->dualRHS).workArray.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pdVar6 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar17 = 0;
              do {
                lVar14 = (long)*(int *)((long)&this->multi_choice[0].rowOut + lVar17);
                if (-1 < lVar14) {
                  *(double *)((long)&this->multi_choice[0].baseValue + lVar17) = pdVar7[lVar14];
                  *(double *)((long)&this->multi_choice[0].baseLower + lVar17) = pdVar8[lVar14];
                  *(double *)((long)&this->multi_choice[0].baseUpper + lVar17) = pdVar9[lVar14];
                  *(double *)((long)&this->multi_choice[0].infeasValue + lVar17) = pdVar5[lVar14];
                  dVar2 = pdVar6[lVar14];
                  *(double *)((long)&this->multi_choice[0].infeasEdWt + lVar17) = dVar2;
                  *(double *)((long)&this->multi_choice[0].infeasLimit + lVar17) =
                       (pdVar5[lVar14] / dVar2) * dVar20;
                }
                lVar17 = lVar17 + 0x260;
              } while ((long)iVar4 * 0x260 - lVar17 != 0);
            }
            this->multi_nFinish = 0;
            return;
          }
        }
        piVar18 = (int *)local_40;
        local_34 = 0;
        chIndex = (int *)(local_40 + -((ulong)(uint)this->multi_num * 4 + 0xf & 0xfffffffffffffff0))
        ;
        iVar4 = this->multi_num;
        chIndex[-2] = 0x11d127;
        chIndex[-1] = 0;
        HDualRHS::choose_multi_HGauto(this_00,chIndex,(int *)&local_34,iVar4);
        dVar20 = (this->dualRHS).workCutoff;
      } while (((local_34 != 0) || (dVar20 != 0.0)) || (NAN(dVar20)));
    }
  }
  return;
}

Assistant:

void HDual::major_chooseRow() {

    /**
     * 0. Initial check to see if we need to do it again
     */
    if (model->countUpdate == 0)
        multi_chooseAgain = 1;
    if (!multi_chooseAgain)
        return;
    multi_chooseAgain = 0;
    multi_iteration++;

    /**
     * Major loop:
     *     repeat 1-5, until we found a good sets of choices
     */
    for (;;) {
        // 1. Multiple CHUZR
        int initialCount = 0;
        int choiceIndex[multi_num];
        dualRHS.choose_multi_HGauto(&choiceIndex[0], &initialCount, multi_num);
//        dualRHS.choose_multi_global(&choiceIndex[0], &initialCount, multi_num);
        if (initialCount == 0 && dualRHS.workCutoff == 0) {
            // OPTIMAL
            return;
        }

        // 2. Shrink the size by cutoff
        int choiceCount = 0;
        for (int i = 0; i < initialCount; i++) {
            int iRow = choiceIndex[i];
            if (dualRHS.workArray[iRow] / dualRHS.workEdWt[iRow]
                    >= dualRHS.workCutoff) {
                choiceIndex[choiceCount++] = iRow;
            }
        }
        if (initialCount == 0 || choiceCount <= initialCount / 3) {
            // Need to do the list again
            dualRHS.create_infeasList(columnDensity);
            continue;
        }

        // 3. Store the choiceIndex to buffer
        for (int ich = 0; ich < multi_num; ich++)
            multi_choice[ich].rowOut = -1;
        for (int ich = 0; ich < choiceCount; ich++)
            multi_choice[ich].rowOut = choiceIndex[ich];

        // 4. Parallel BTRAN and compute weight
        major_chooseRowBtran();

        // 5. Update row weights
        for (int ich = 0; ich < multi_num; ich++) {
            if (multi_choice[ich].rowOut >= 0) {
                row_epDensity *= 0.95;
                row_epDensity += 0.05 * multi_choice[ich].row_ep.count / numRow;
            }
        }

        // 6. Check updated and computed weight
        int countWrongEdWt = 0;
        for (int i = 0; i < multi_num; i++) {
            const int iRow = multi_choice[i].rowOut;
            if (iRow < 0)
                continue;
            double u_weight = dualRHS.workEdWt[iRow];
            double c_weight = dualRHS.workEdWt[iRow] =
                    multi_choice[i].infeasEdWt;
            if (u_weight < 0.25 * c_weight) {
                multi_choice[i].rowOut = -1;
                countWrongEdWt++;
            }
        }
        if (countWrongEdWt <= choiceCount / 3)
            break;
    }

    // 6. Take other info associated with choices
    double pamiCutoff = model->dblOption[DBLOPT_PAMI_CUTOFF];
    for (int i = 0; i < multi_num; i++) {
        const int iRow = multi_choice[i].rowOut;
        if (iRow < 0)
            continue;
        // Other info
        multi_choice[i].baseValue = baseValue[iRow];
        multi_choice[i].baseLower = baseLower[iRow];
        multi_choice[i].baseUpper = baseUpper[iRow];
        multi_choice[i].infeasValue = dualRHS.workArray[iRow];
        multi_choice[i].infeasEdWt = dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit = dualRHS.workArray[iRow]
                / dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit *= pamiCutoff;
    }

    // 6. Finish count
    multi_nFinish = 0;
}